

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat2wasm.cc
# Opt level: O0

int ProgramMain(int argc,char **argv)

{
  FILE *file;
  bool bVar1;
  Enum EVar2;
  uchar *size;
  Errors *errors_00;
  pointer lexer_00;
  pointer log_stream;
  pointer pMVar3;
  ulong uVar4;
  char *__str;
  OutputBuffer *buffer;
  pointer line_finder_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RCX;
  string_view filename;
  string_view filename_00;
  string local_160;
  undefined1 local_140 [8];
  unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
  line_finder;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_128;
  string local_118;
  Enum local_f8;
  Enum local_f4;
  undefined1 local_f0 [8];
  MemoryStream stream;
  undefined1 local_bb [8];
  ValidateOptions options;
  undefined1 local_9d [8];
  WastParseOptions parse_wast_options;
  unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> module;
  basic_string_view<char,_std::char_traits<char>_> local_78;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> local_68;
  unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_> lexer;
  Errors errors;
  size_t local_40;
  Result local_34;
  undefined1 local_30 [4];
  Result result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> file_data;
  char **argv_local;
  int argc_local;
  
  wabt::InitStdio();
  ParseOptions(argc,argv);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             &errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,s_infile);
  filename._M_str = local_30;
  filename._M_len = local_40;
  local_34 = wabt::ReadFile((wabt *)errors.
                                    super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,filename,
                            in_RCX);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&lexer);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_78,s_infile);
  size = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  errors_00 = (Errors *)
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  filename_00._M_str = (char *)local_78._M_len;
  filename_00._M_len = (size_t)&local_68;
  wabt::WastLexer::CreateBufferLexer(filename_00,local_78._M_str,(size_t)size,errors_00);
  bVar1 = wabt::Failed(local_34);
  if (bVar1) {
    fprintf(_stderr,"unable to read file: %s\n",s_infile);
    exit(1);
  }
  std::unique_ptr<wabt::Module,std::default_delete<wabt::Module>>::
  unique_ptr<std::default_delete<wabt::Module>,void>
            ((unique_ptr<wabt::Module,std::default_delete<wabt::Module>> *)
             &parse_wast_options.features.gc_enabled_);
  wabt::WastParseOptions::WastParseOptions((WastParseOptions *)local_9d,&s_features);
  lexer_00 = std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::get(&local_68)
  ;
  options.features._11_4_ =
       wabt::ParseWatModule
                 (lexer_00,(unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
                           &parse_wast_options.features.gc_enabled_,(Errors *)&lexer,
                  (WastParseOptions *)local_9d);
  options.features._15_4_ = options.features._11_4_;
  local_34 = (Result)options.features._11_4_;
  bVar1 = wabt::Succeeded((Result)options.features._11_4_);
  if ((bVar1) && ((s_validate & 1U) != 0)) {
    wabt::ValidateOptions::ValidateOptions((ValidateOptions *)local_bb,&s_features);
    pMVar3 = std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::get
                       ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
                        &parse_wast_options.features.gc_enabled_);
    local_34 = wabt::ValidateModule(pMVar3,(Errors *)&lexer,(ValidateOptions *)local_bb);
  }
  stream.buf_._M_t.
  super___uniq_ptr_impl<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>._M_t.
  super__Tuple_impl<0UL,_wabt::OutputBuffer_*,_std::default_delete<wabt::OutputBuffer>_>.
  super__Head_base<0UL,_wabt::OutputBuffer_*,_false>._M_head_impl._4_4_ = local_34.enum_;
  bVar1 = wabt::Succeeded(local_34);
  if (bVar1) {
    log_stream = std::unique_ptr<wabt::FileStream,_std::default_delete<wabt::FileStream>_>::get
                           (&s_log_stream);
    wabt::MemoryStream::MemoryStream((MemoryStream *)local_f0,&log_stream->super_Stream);
    s_write_binary_options.features.exceptions_enabled_ = s_features.exceptions_enabled_;
    s_write_binary_options.features.mutable_globals_enabled_ = s_features.mutable_globals_enabled_;
    s_write_binary_options.features.sat_float_to_int_enabled_ = s_features.sat_float_to_int_enabled_
    ;
    s_write_binary_options.features.sign_extension_enabled_ = s_features.sign_extension_enabled_;
    s_write_binary_options.features.simd_enabled_ = s_features.simd_enabled_;
    s_write_binary_options.features.threads_enabled_ = s_features.threads_enabled_;
    s_write_binary_options.features.function_references_enabled_ =
         s_features.function_references_enabled_;
    s_write_binary_options.features.multi_value_enabled_ = s_features.multi_value_enabled_;
    s_write_binary_options.features.tail_call_enabled_ = s_features.tail_call_enabled_;
    s_write_binary_options.features.bulk_memory_enabled_ = s_features.bulk_memory_enabled_;
    s_write_binary_options.features.reference_types_enabled_ = s_features.reference_types_enabled_;
    s_write_binary_options.features.annotations_enabled_ = s_features.annotations_enabled_;
    s_write_binary_options.features.code_metadata_enabled_ = s_features.code_metadata_enabled_;
    s_write_binary_options.features.gc_enabled_ = s_features.gc_enabled_;
    s_write_binary_options.features.memory64_enabled_ = s_features.memory64_enabled_;
    s_write_binary_options.features.multi_memory_enabled_ = s_features.multi_memory_enabled_;
    s_write_binary_options.features.extended_const_enabled_ = s_features.extended_const_enabled_;
    s_write_binary_options.features.relaxed_simd_enabled_ = s_features.relaxed_simd_enabled_;
    s_write_binary_options.features.custom_page_sizes_enabled_ =
         s_features.custom_page_sizes_enabled_;
    pMVar3 = std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::get
                       ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
                        &parse_wast_options.features.gc_enabled_);
    local_f8 = (Enum)wabt::WriteBinaryModule((Stream *)local_f0,pMVar3,&s_write_binary_options);
    local_f4 = local_f8;
    local_34 = (Result)local_f8;
    bVar1 = wabt::Succeeded((Result)local_f8);
    if (bVar1) {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) != 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)&local_128,s_infile);
        DefaultOuputName_abi_cxx11_(&local_118,(string_view)local_128);
        std::__cxx11::string::operator=((string *)&s_outfile_abi_cxx11_,(string *)&local_118);
        std::__cxx11::string::~string((string *)&local_118);
      }
      __str = (char *)std::__cxx11::string::c_str();
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&line_finder,__str);
      buffer = wabt::MemoryStream::output_buffer((MemoryStream *)local_f0);
      WriteBufferToFile(_line_finder,buffer);
    }
    wabt::MemoryStream::~MemoryStream((MemoryStream *)local_f0);
  }
  std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::operator->(&local_68);
  wabt::WastLexer::MakeLineFinder((WastLexer *)local_140);
  line_finder_00 =
       std::
       unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>::
       get((unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
            *)local_140);
  file = _stderr;
  std::__cxx11::string::string((string *)&local_160);
  wabt::FormatErrorsToFile((Errors *)&lexer,Text,line_finder_00,(FILE *)file,&local_160,Never,0x50);
  std::__cxx11::string::~string((string *)&local_160);
  EVar2 = wabt::Result::operator_cast_to_Enum(&local_34);
  std::unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>::
  ~unique_ptr((unique_ptr<wabt::LexerSourceLineFinder,_std::default_delete<wabt::LexerSourceLineFinder>_>
               *)local_140);
  std::unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_>::~unique_ptr
            ((unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)
             &parse_wast_options.features.gc_enabled_);
  std::unique_ptr<wabt::WastLexer,_std::default_delete<wabt::WastLexer>_>::~unique_ptr(&local_68);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector
            ((vector<wabt::Error,_std::allocator<wabt::Error>_> *)&lexer);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return (uint)(EVar2 != Ok);
}

Assistant:

int ProgramMain(int argc, char** argv) {
  InitStdio();

  ParseOptions(argc, argv);

  std::vector<uint8_t> file_data;
  Result result = ReadFile(s_infile, &file_data);
  Errors errors;
  std::unique_ptr<WastLexer> lexer = WastLexer::CreateBufferLexer(
      s_infile, file_data.data(), file_data.size(), &errors);
  if (Failed(result)) {
    WABT_FATAL("unable to read file: %s\n", s_infile);
  }

  std::unique_ptr<Module> module;
  WastParseOptions parse_wast_options(s_features);
  result = ParseWatModule(lexer.get(), &module, &errors, &parse_wast_options);

  if (Succeeded(result) && s_validate) {
    ValidateOptions options(s_features);
    result = ValidateModule(module.get(), &errors, options);
  }

  if (Succeeded(result)) {
    MemoryStream stream(s_log_stream.get());
    s_write_binary_options.features = s_features;
    result = WriteBinaryModule(&stream, module.get(), s_write_binary_options);

    if (Succeeded(result)) {
      if (s_outfile.empty()) {
        s_outfile = DefaultOuputName(s_infile);
      }
      WriteBufferToFile(s_outfile.c_str(), stream.output_buffer());
    }
  }

  auto line_finder = lexer->MakeLineFinder();
  FormatErrorsToFile(errors, Location::Type::Text, line_finder.get());

  return result != Result::Ok;
}